

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

void later_cb(Fl_Widget *param_1,void *param_2)

{
  Fl_Type *pFVar1;
  bool bVar2;
  Fl_Type *g;
  Fl_Type *this;
  
  if (Fl_Type::last != (Fl_Type *)0x0) {
    bVar2 = false;
    g = Fl_Type::last;
    do {
      pFVar1 = g->prev;
      this = g;
      if (g->selected != '\0') {
        do {
          this = this->next;
          if (this == (Fl_Type *)0x0) goto LAB_00181616;
        } while (g->level < this->level);
        if ((this->level == g->level) && (this->selected == '\0')) {
          Fl_Type::move_before(this,g);
          bVar2 = true;
        }
      }
LAB_00181616:
      g = pFVar1;
    } while (pFVar1 != (Fl_Type *)0x0);
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void later_cb(Fl_Widget*,void*) {
  Fl_Type *f;
  int mod = 0;
  for (f = Fl_Type::last; f; ) {
    Fl_Type* prv = f->prev;
    if (f->selected) {
      Fl_Type* g;
      for (g = f->next; g && g->level > f->level; g = g->next) {/*empty*/}
      if (g && g->level == f->level && !g->selected) {
        g->move_before(f);
        mod = 1;
      }
    }
    f = prv;
  }
  if (mod) set_modflag(1);
}